

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xoshiro.hpp
# Opt level: O1

void __thiscall Xoshiro::Xoshiro256PP::Xoshiro256PP(Xoshiro256PP *this,uint64_t seed)

{
  ulong uVar1;
  
  uVar1 = (seed + 0x9e3779b97f4a7c15 >> 0x1e ^ seed + 0x9e3779b97f4a7c15) * -0x40a7b892e31b1a47;
  uVar1 = (uVar1 >> 0x1b ^ uVar1) * -0x6b2fb644ecceee15;
  uVar1 = (uVar1 >> 0x1f ^ uVar1) + 0x9e3779b97f4a7c15;
  uVar1 = (uVar1 >> 0x1e ^ uVar1) * -0x40a7b892e31b1a47;
  uVar1 = (uVar1 >> 0x1b ^ uVar1) * -0x6b2fb644ecceee15;
  uVar1 = uVar1 >> 0x1f ^ uVar1;
  this->state[0] = uVar1;
  uVar1 = uVar1 + 0x9e3779b97f4a7c15;
  uVar1 = (uVar1 >> 0x1e ^ uVar1) * -0x40a7b892e31b1a47;
  uVar1 = (uVar1 >> 0x1b ^ uVar1) * -0x6b2fb644ecceee15;
  uVar1 = uVar1 >> 0x1f ^ uVar1;
  this->state[1] = uVar1;
  uVar1 = uVar1 + 0x9e3779b97f4a7c15;
  uVar1 = (uVar1 >> 0x1e ^ uVar1) * -0x40a7b892e31b1a47;
  uVar1 = (uVar1 >> 0x1b ^ uVar1) * -0x6b2fb644ecceee15;
  uVar1 = uVar1 >> 0x1f ^ uVar1;
  this->state[2] = uVar1;
  uVar1 = uVar1 + 0x9e3779b97f4a7c15;
  uVar1 = (uVar1 >> 0x1e ^ uVar1) * -0x40a7b892e31b1a47;
  uVar1 = (uVar1 >> 0x1b ^ uVar1) * -0x6b2fb644ecceee15;
  this->state[3] = uVar1 >> 0x1f ^ uVar1;
  return;
}

Assistant:

Xoshiro256PP(const uint64_t seed) noexcept
    {
        this->seed(seed);
    }